

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

void __thiscall
dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
          (AttentionalModel<dynet::GRUBuilder> *this,Model *model,uint vocab_size_src,
          uint _vocab_size_tgt,uint layers,uint hidden_dim,uint align_dim,bool _rnn_src_embeddings,
          bool _giza_positional,bool _giza_markov,bool _giza_fertility,bool _doc_context,
          bool _global_fertility)

{
  pointer *ppPVar1;
  uint v_2;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint v_3;
  iterator __position;
  int iVar6;
  uint v;
  undefined1 auVar7 [16];
  undefined8 local_a0;
  undefined8 uStack_98;
  uint local_90 [7];
  ulong local_74;
  uint local_6c;
  uint local_68 [2];
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  GRUBuilder *local_48;
  GRUBuilder *local_40;
  GRUBuilder *local_38;
  
  local_50 = (uint)_giza_fertility;
  local_54 = (uint)_giza_markov;
  local_58 = (uint)_giza_positional;
  local_4c = vocab_size_src;
  dynet::LookupParameter::LookupParameter(&this->p_cs);
  dynet::LookupParameter::LookupParameter(&this->p_ct);
  dynet::Parameter::Parameter(&this->p_R);
  dynet::Parameter::Parameter(&this->p_Q);
  dynet::Parameter::Parameter(&this->p_P);
  dynet::Parameter::Parameter(&this->p_S);
  dynet::Parameter::Parameter(&this->p_bias);
  dynet::Parameter::Parameter(&this->p_Wa);
  local_60 = &this->p_Wh0;
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dynet::Parameter::Parameter(&this->p_Ua);
  dynet::Parameter::Parameter(&this->p_va);
  dynet::Parameter::Parameter(&this->p_Ta);
  dynet::Parameter::Parameter(&this->p_Wfhid);
  dynet::Parameter::Parameter(&this->p_Wfmu);
  dynet::Parameter::Parameter(&this->p_Wfvar);
  dynet::Parameter::Parameter(&this->p_bfhid);
  dynet::Parameter::Parameter(&this->p_bfmu);
  dynet::Parameter::Parameter(&this->p_bfvar);
  local_38 = &this->builder;
  local_6c = hidden_dim * 2;
  uVar4 = hidden_dim * 3;
  if (!_rnn_src_embeddings) {
    uVar4 = local_6c;
  }
  dynet::GRUBuilder::GRUBuilder(local_38,layers,uVar4,hidden_dim,model);
  local_40 = &this->builder_src_fwd;
  dynet::GRUBuilder::GRUBuilder(local_40,1,hidden_dim,hidden_dim,model);
  local_48 = &this->builder_src_bwd;
  dynet::GRUBuilder::GRUBuilder(local_48,1,hidden_dim,hidden_dim,model);
  auVar7 = vpbroadcastb_avx512vl(ZEXT116(1));
  this->rnn_src_embeddings = (bool)(_rnn_src_embeddings * auVar7[0]);
  this->giza_positional =
       (bool)(((byte)(_rnn_src_embeddings | (byte)((char)local_58 << 7) >> 6) >> 1) * auVar7[1]);
  this->giza_markov = (bool)(((byte)local_54 & 1) * auVar7[2]);
  this->giza_fertility = (bool)(((byte)local_50 & 1) * auVar7[3]);
  this->doc_context = _doc_context;
  this->global_fertility = _global_fertility;
  this->vocab_size_tgt = _vocab_size_tgt;
  (this->src).pg = (ComputationGraph *)0x0;
  (this->src).i.t = 0;
  (this->i_R).pg = (ComputationGraph *)0x0;
  (this->i_R).i.t = 0;
  (this->i_Q).pg = (ComputationGraph *)0x0;
  (this->i_Q).i.t = 0;
  (this->i_P).pg = (ComputationGraph *)0x0;
  (this->i_P).i.t = 0;
  (this->i_S).pg = (ComputationGraph *)0x0;
  (this->i_S).i.t = 0;
  (this->i_bias).pg = (ComputationGraph *)0x0;
  (this->i_bias).i.t = 0;
  (this->i_Wa).pg = (ComputationGraph *)0x0;
  (this->i_Wa).i.t = 0;
  (this->i_Ua).pg = (ComputationGraph *)0x0;
  (this->i_Ua).i.t = 0;
  (this->i_va).pg = (ComputationGraph *)0x0;
  (this->i_va).i.t = 0;
  (this->i_uax).pg = (ComputationGraph *)0x0;
  (this->i_uax).i.t = 0;
  (this->i_Ta).pg = (ComputationGraph *)0x0;
  (this->i_Ta).i.t = 0;
  (this->i_src_idx).pg = (ComputationGraph *)0x0;
  (this->i_src_idx).i.t = 0;
  (this->i_src_len).pg = (ComputationGraph *)0x0;
  (this->i_src_len).i.t = 0;
  (this->i_tt_ctx).pg = (ComputationGraph *)0x0;
  (this->i_tt_ctx).i.t = 0;
  *(undefined8 *)
   ((long)&(this->aligns).
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_vecs).
           super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aligns).
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aux_vecs).
  super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_74 = 0x100000001;
  local_90[0] = hidden_dim;
  auVar7 = dynet::Model::add_lookup_parameters((uint)model,(Dim *)(ulong)local_4c);
  this->p_cs = (LookupParameter)auVar7[0];
  *(long *)&this->field_0x1 = auVar7._1_8_;
  *(int7 *)&this->field_0x9 = auVar7._9_7_;
  local_74 = 0x100000001;
  local_90[0] = hidden_dim;
  auVar7 = dynet::Model::add_lookup_parameters((uint)model,(Dim *)(ulong)this->vocab_size_tgt);
  this->p_ct = (LookupParameter)auVar7[0];
  *(long *)&this->field_0x11 = auVar7._1_8_;
  *(int7 *)&this->field_0x19 = auVar7._9_7_;
  local_a0 = CONCAT44(hidden_dim,this->vocab_size_tgt);
  local_74 = 0x100000000;
  lVar3 = 0;
  do {
    uVar5 = local_74 & 0xffffffff;
    local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
    local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_R = (Parameter)auVar7[0];
  *(long *)&this->field_0x21 = auVar7._1_8_;
  *(int7 *)&this->field_0x29 = auVar7._9_7_;
  local_a0 = CONCAT44(hidden_dim,hidden_dim);
  local_74 = 0x100000000;
  lVar3 = 0;
  do {
    uVar5 = local_74 & 0xffffffff;
    local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
    local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_P = (Parameter)auVar7[0];
  *(long *)&this->field_0x41 = auVar7._1_8_;
  *(int7 *)&this->field_0x49 = auVar7._9_7_;
  local_90[0] = this->vocab_size_tgt;
  local_74 = 0x100000001;
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_bias = (Parameter)auVar7[0];
  *(long *)&this->field_0x61 = auVar7._1_8_;
  *(int7 *)&this->field_0x69 = auVar7._9_7_;
  local_a0 = CONCAT44(layers * hidden_dim,align_dim);
  local_74 = 0x100000000;
  lVar3 = 0;
  do {
    uVar5 = local_74 & 0xffffffff;
    local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
    local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Wa = (Parameter)auVar7[0];
  *(long *)&this->field_0x71 = auVar7._1_8_;
  *(int7 *)&this->field_0x79 = auVar7._9_7_;
  if (this->rnn_src_embeddings == true) {
    local_a0 = CONCAT44(local_6c,align_dim);
    local_74 = 0x100000000;
    lVar3 = 0;
    do {
      uVar5 = local_74 & 0xffffffff;
      local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
      local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Ua = (Parameter)auVar7[0];
    *(long *)&this->field_0x99 = auVar7._1_8_;
    *(int7 *)&this->field_0xa1 = auVar7._9_7_;
    local_a0 = CONCAT44(local_6c,hidden_dim);
    local_74 = 0x100000000;
    lVar3 = 0;
    do {
      uVar5 = local_74 & 0xffffffff;
      local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
      local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  }
  else {
    local_a0 = CONCAT44(hidden_dim,align_dim);
    local_74 = 0x100000000;
    lVar3 = 0;
    do {
      uVar5 = local_74 & 0xffffffff;
      local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
      local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Ua = (Parameter)auVar7[0];
    *(long *)&this->field_0x99 = auVar7._1_8_;
    *(int7 *)&this->field_0xa1 = auVar7._9_7_;
    local_a0 = CONCAT44(hidden_dim,hidden_dim);
    local_74 = 0x100000000;
    lVar3 = 0;
    do {
      uVar5 = local_74 & 0xffffffff;
      local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
      local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  }
  this->p_Q = (Parameter)auVar7[0];
  *(long *)&this->field_0x31 = auVar7._1_8_;
  *(int7 *)&this->field_0x39 = auVar7._9_7_;
  iVar2 = 3;
  if (this->giza_positional == false) {
    iVar2 = 0;
    if ((this->giza_markov == false) && (iVar2 = 0, this->giza_fertility != true))
    goto LAB_00141032;
  }
  iVar6 = iVar2 + 3;
  if (this->giza_markov == false) {
    iVar6 = iVar2;
  }
  iVar2 = iVar6 + 3;
  if (this->giza_fertility == false) {
    iVar2 = iVar6;
  }
  local_a0 = CONCAT44(iVar2,align_dim);
  local_74 = 0x100000000;
  lVar3 = 0;
  do {
    uVar5 = local_74 & 0xffffffff;
    local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
    local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_Ta = (Parameter)auVar7[0];
  *(long *)&this->field_0xb9 = auVar7._1_8_;
  *(int7 *)&this->field_0xc1 = auVar7._9_7_;
LAB_00141032:
  local_74 = 0x100000001;
  local_90[0] = align_dim;
  auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
  this->p_va = (Parameter)auVar7[0];
  *(long *)&this->field_0xa9 = auVar7._1_8_;
  *(int7 *)&this->field_0xb1 = auVar7._9_7_;
  if (this->doc_context == true) {
    if (this->rnn_src_embeddings == true) {
      local_a0 = CONCAT44(local_6c,hidden_dim);
      local_74 = 0x100000000;
      lVar3 = 0;
      do {
        uVar5 = local_74 & 0xffffffff;
        local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
        local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    else {
      local_a0 = CONCAT44(hidden_dim,hidden_dim);
      local_74 = 0x100000000;
      lVar3 = 0;
      do {
        uVar5 = local_74 & 0xffffffff;
        local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
        local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    this->p_S = (Parameter)auVar7[0];
    *(long *)&this->field_0x51 = auVar7._1_8_;
    *(int7 *)&this->field_0x59 = auVar7._9_7_;
  }
  if (this->global_fertility == true) {
    if (this->rnn_src_embeddings == true) {
      local_a0 = CONCAT44(local_6c,hidden_dim);
      local_74 = 0x100000000;
      lVar3 = 0;
      do {
        uVar5 = local_74 & 0xffffffff;
        local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
        local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    else {
      local_a0 = CONCAT44(hidden_dim,hidden_dim);
      local_74 = 0x100000000;
      lVar3 = 0;
      do {
        uVar5 = local_74 & 0xffffffff;
        local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
        local_90[uVar5] = *(uint *)((long)&local_a0 + lVar3);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
      auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    }
    this->p_Wfhid = (Parameter)auVar7[0];
    *(long *)&this->field_0xc9 = auVar7._1_8_;
    *(int7 *)&this->field_0xd1 = auVar7._9_7_;
    local_74 = 0x100000001;
    local_90[0] = hidden_dim;
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfhid = (Parameter)auVar7[0];
    *(long *)&this->field_0xf9 = auVar7._1_8_;
    *(int7 *)&this->field_0x101 = auVar7._9_7_;
    local_74 = 0x100000001;
    local_90[0] = hidden_dim;
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Wfmu = (Parameter)auVar7[0];
    *(long *)&this->field_0xd9 = auVar7._1_8_;
    *(int7 *)&this->field_0xe1 = auVar7._9_7_;
    local_74 = 0x100000001;
    local_90[0] = 1;
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfmu = (Parameter)auVar7[0];
    *(long *)&this->field_0x109 = auVar7._1_8_;
    *(int7 *)&this->field_0x111 = auVar7._9_7_;
    local_74 = 0x100000001;
    local_90[0] = hidden_dim;
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_Wfvar = (Parameter)auVar7[0];
    *(long *)&this->field_0xe9 = auVar7._1_8_;
    *(int7 *)&this->field_0xf1 = auVar7._9_7_;
    local_74 = 0x100000001;
    local_90[0] = 1;
    auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
    this->p_bfvar = (Parameter)auVar7[0];
    *(long *)&this->field_0x119 = auVar7._1_8_;
    *(int7 *)&this->field_0x121 = auVar7._9_7_;
  }
  iVar2 = *(int *)&this->field_0x1bc;
  if (0 < iVar2) {
    iVar6 = 0;
    do {
      if (this->rnn_src_embeddings == true) {
        local_68[0] = hidden_dim;
        local_68[1] = local_6c;
        local_74 = 0x100000000;
        lVar3 = 0;
        do {
          uVar5 = local_74 & 0xffffffff;
          local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
          local_90[uVar5] = *(uint *)((long)local_68 + lVar3);
          lVar3 = lVar3 + 4;
        } while (lVar3 != 8);
        auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
        uStack_98 = auVar7._8_8_;
        local_a0 = auVar7._0_8_;
        __position._M_current =
             (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
          _M_realloc_insert<dynet::Parameter>(local_60,__position,(Parameter *)&local_a0);
        }
        else {
LAB_00141389:
          *(undefined8 *)__position._M_current = local_a0;
          *(undefined8 *)(__position._M_current + 8) = uStack_98;
          ppPVar1 = &(this->p_Wh0).
                     super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + 0x10;
        }
      }
      else {
        local_68[0] = hidden_dim;
        local_68[1] = hidden_dim;
        local_74 = 0x100000000;
        lVar3 = 0;
        do {
          uVar5 = local_74 & 0xffffffff;
          local_74 = CONCAT44(local_74._4_4_,(int)local_74 + 1);
          local_90[uVar5] = *(uint *)((long)local_68 + lVar3);
          lVar3 = lVar3 + 4;
        } while (lVar3 != 8);
        auVar7 = dynet::Model::add_parameters((Dim *)model,0.0);
        uStack_98 = auVar7._8_8_;
        local_a0 = auVar7._0_8_;
        __position._M_current =
             (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00141389;
        std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
        _M_realloc_insert<dynet::Parameter>(local_60,__position,(Parameter *)&local_a0);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar2);
  }
  return;
}

Assistant:

AttentionalModel<Builder>::AttentionalModel(dynet::Model* model,
    unsigned vocab_size_src, unsigned _vocab_size_tgt, unsigned layers, unsigned hidden_dim, 
    unsigned align_dim, bool _rnn_src_embeddings, bool _giza_positional, 
    bool _giza_markov, bool _giza_fertility, bool _doc_context,
    bool _global_fertility)
: builder(layers, (_rnn_src_embeddings) ? 3*hidden_dim : 2*hidden_dim, hidden_dim, *model),
  builder_src_fwd(1, hidden_dim, hidden_dim, *model),
  builder_src_bwd(1, hidden_dim, hidden_dim, *model),
  rnn_src_embeddings(_rnn_src_embeddings), 
  giza_positional(_giza_positional), giza_markov(_giza_markov), giza_fertility(_giza_fertility),
  doc_context(_doc_context),
  global_fertility(_global_fertility),
  vocab_size_tgt(_vocab_size_tgt),
  num_aux_vecs(0)
{
    //std::cerr << "Attentionalmodel(" << vocab_size_src  << " " <<  _vocab_size_tgt  << " " <<  layers  << " " <<  hidden_dim << " " <<  align_dim  << " " <<  _rnn_src_embeddings  << " " <<  _giza_extentions  << " " <<  _doc_context << ")\n";
    
    p_cs = model->add_lookup_parameters(vocab_size_src, {hidden_dim}); 
    p_ct = model->add_lookup_parameters(vocab_size_tgt, {hidden_dim}); 
    p_R = model->add_parameters({vocab_size_tgt, hidden_dim});
    p_P = model->add_parameters({hidden_dim, hidden_dim});
    p_bias = model->add_parameters({vocab_size_tgt});
    p_Wa = model->add_parameters({align_dim, layers*hidden_dim});
    if (rnn_src_embeddings) {
        p_Ua = model->add_parameters({align_dim, 2*hidden_dim});
	p_Q = model->add_parameters({hidden_dim, 2*hidden_dim});
    } else {
        p_Ua = model->add_parameters({align_dim, hidden_dim});
	p_Q = model->add_parameters({hidden_dim, hidden_dim});
    }
    if (giza_positional || giza_markov || giza_fertility) {
        int num_giza = 0;
        if (giza_positional) num_giza += 3;
        if (giza_markov) num_giza += 3;
        if (giza_fertility) num_giza += 3;
        p_Ta = model->add_parameters({align_dim, (unsigned int)num_giza});
    }
    p_va = model->add_parameters({align_dim});

    if (doc_context) {
        if (rnn_src_embeddings) {
            p_S = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_S = model->add_parameters({hidden_dim, hidden_dim});
        }
    }

    if (global_fertility) {
        if (rnn_src_embeddings) {
            p_Wfhid = model->add_parameters({hidden_dim, 2*hidden_dim});
        } else {
            p_Wfhid = model->add_parameters({hidden_dim, hidden_dim});
        }
        p_bfhid = model->add_parameters({hidden_dim});
        p_Wfmu = model->add_parameters({hidden_dim});
        p_bfmu = model->add_parameters({1});
        p_Wfvar = model->add_parameters({hidden_dim});
        p_bfvar = model->add_parameters({1});
    }

    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	if (rnn_src_embeddings)
	    p_Wh0.push_back(model->add_parameters({hidden_dim, 2*hidden_dim}));
	else
	    p_Wh0.push_back(model->add_parameters({hidden_dim, hidden_dim}));
    }
}